

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SpawnMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  VMValue *pVVar3;
  AActor *pAVar4;
  int iVar5;
  PClassActor *type;
  char *pcVar6;
  AActor *dest;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_00433ca1;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00433c7f:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00433ca1:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1978,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_00433b25;
    bVar2 = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00433ca1;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_00433c7f;
LAB_00433b25:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_00433cc0;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00433c88:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00433cc0;
  }
  dest = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_00433b62;
LAB_00433b77:
    bVar2 = DObject::IsKindOf((DObject *)dest,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00433cc0:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1979,
                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_00433c88;
LAB_00433b62:
    NullParam("\"dest\"");
    dest = (AActor *)param[1].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_00433b77;
    dest = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_00433cdf;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_00433c91:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00433cdf:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x197a,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_00433be8;
    bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar2) {
      pcVar6 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_00433cdf;
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_00433c91;
LAB_00433be8:
    type = (PClassActor *)0x0;
  }
  if (numparam == 3) {
    pVVar1 = defaultparam->Array;
    if ((pVVar1[3].field_0.field_3.Type == '\x03') &&
       ((pVVar3 = pVVar1 + 3, pVVar1[3].field_0.field_1.atag == 1 ||
        ((pVVar3->field_0).field_1.a == (void *)0x0)))) {
LAB_00433c3a:
      pAVar4 = P_SpawnMissile(pAVar4,dest,type,(AActor *)(pVVar3->field_0).field_1.a);
      if (numret < 1) {
        iVar5 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197c,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar5 = 1;
        VMReturn::SetPointer(ret,pAVar4,1);
      }
      return iVar5;
    }
    pcVar6 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
  }
  else {
    if ((param[3].field_0.field_3.Type == '\x03') &&
       ((pVVar3 = param + 3, param[3].field_0.field_1.atag == 1 ||
        ((pVVar3->field_0).field_1.a == (void *)0x0)))) goto LAB_00433c3a;
    pcVar6 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x197b,
                "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissile(self, dest, type, owner));
}